

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void BM_Check1(int n)

{
  string *psVar1;
  int iVar2;
  CheckOpString local_40;
  LogMessage local_38;
  
  do {
    if (n < 1) {
      return;
    }
    iVar2 = n + -1;
    local_40.str_ = (string *)(CONCAT44(local_40.str_._4_4_,x - 1) | 5);
    local_38.allocated_._0_4_ = iVar2;
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_38,(int *)&local_40,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_40.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x73,&local_40);
      google::LogMessage::stream(&local_38);
      goto LAB_001123c2;
    }
    local_40.str_ = (string *)(CONCAT44(local_40.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
      local_38.allocated_._0_4_ = iVar2;
    }
    else {
      local_38.allocated_._0_4_ = iVar2;
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_38,(int *)&local_40,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_40.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x74,&local_40);
      google::LogMessage::stream(&local_38);
      goto LAB_001123c2;
    }
    local_38.allocated_._0_4_ = n + -1;
    local_40.str_ = (string *)(CONCAT44(local_40.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_38,(int *)&local_40,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_40.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x75,&local_40);
      google::LogMessage::stream(&local_38);
      goto LAB_001123c2;
    }
    local_38.allocated_._0_4_ = n + -1;
    local_40.str_ = (string *)(CONCAT44(local_40.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_38,(int *)&local_40,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_40.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x76,&local_40);
      google::LogMessage::stream(&local_38);
      goto LAB_001123c2;
    }
    local_38.allocated_._0_4_ = n + -1;
    local_40.str_ = (string *)(CONCAT44(local_40.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_38,(int *)&local_40,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_40.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x77,&local_40);
      google::LogMessage::stream(&local_38);
      goto LAB_001123c2;
    }
    local_38.allocated_._0_4_ = n + -1;
    local_40.str_ = (string *)(CONCAT44(local_40.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_38,(int *)&local_40,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_40.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x78,&local_40);
      google::LogMessage::stream(&local_38);
      goto LAB_001123c2;
    }
    local_38.allocated_._0_4_ = n + -1;
    local_40.str_ = (string *)(CONCAT44(local_40.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_38,(int *)&local_40,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_40.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x79,&local_40);
      google::LogMessage::stream(&local_38);
      goto LAB_001123c2;
    }
    local_38.allocated_._0_4_ = n + -1;
    local_40.str_ = (string *)(CONCAT44(local_40.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_38,(int *)&local_40,"n >= x");
    }
    n = n + -1;
  } while (psVar1 == (string *)0x0);
  local_40.str_ = psVar1;
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x7a,&local_40);
  google::LogMessage::stream(&local_38);
LAB_001123c2:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

static void BM_Check1(int n) {
  while (n-- > 0) {
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
  }
}